

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_aver_s_b_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = (ulong)wd * 0x10;
  lVar5 = (ulong)ws * 0x10;
  lVar4 = (ulong)wt * 0x10;
  bVar1 = *(byte *)((env->active_fpu).fpr + ws);
  bVar2 = *(byte *)((env->active_fpu).fpr + wt);
  *(byte *)((env->active_fpu).fpr + wd) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 1);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 1);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 1) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 2);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 2);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 2) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 3);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 3);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 3) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 4);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 4);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 4) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 5);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 5);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 5) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 6);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 6);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 6) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 7);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 7);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 7) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 8);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 8);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 8) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 9);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 9);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 9) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 10);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 10);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 10) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xb);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xb);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xb) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xc);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xc);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xc) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xd);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xd);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xd) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xe);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xe);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xe) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar5 + 0xf);
  bVar2 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xf);
  *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xf) =
       ((bVar2 | bVar1) & 1) + ((char)bVar2 >> 1) + ((char)bVar1 >> 1);
  return;
}

Assistant:

void helper_msa_aver_s_b(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_aver_s_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_aver_s_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_aver_s_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_aver_s_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_aver_s_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_aver_s_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_aver_s_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_aver_s_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_aver_s_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_aver_s_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_aver_s_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_aver_s_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_aver_s_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_aver_s_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_aver_s_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_aver_s_df(DF_BYTE, pws->b[15], pwt->b[15]);
}